

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_CommandLogging.cpp
# Opt level: O2

bool __thiscall RenX_CommandLoggingPlugin::initialize(RenX_CommandLoggingPlugin *this)

{
  undefined1 uVar1;
  int iVar2;
  string_view in_key;
  string_view in_key_00;
  
  in_key._M_str = "MinPlayerLevelToLog";
  in_key._M_len = 0x13;
  iVar2 = Jupiter::Config::get<int>((Config *)&this->field_0x38,in_key,1);
  this->min_access = iVar2;
  in_key_00._M_str = "MinCommandLevelToLog";
  in_key_00._M_len = 0x14;
  iVar2 = Jupiter::Config::get<int>((Config *)&this->field_0x38,in_key_00,1);
  this->min_cmd_access = iVar2;
  PrepFile(this);
  uVar1 = std::__basic_file<char>::is_open();
  return (bool)uVar1;
}

Assistant:

bool RenX_CommandLoggingPlugin::initialize() {
	RenX_CommandLoggingPlugin::min_access = this->config.get<int>("MinPlayerLevelToLog"sv, 1);
	RenX_CommandLoggingPlugin::min_cmd_access = this->config.get<int>("MinCommandLevelToLog"sv, 1);

	PrepFile();

	return fs.is_open();
}